

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_2::FileState::Read
          (FileState *this,uint64_t offset,size_t n,Slice *result,char *scratch)

{
  size_t __dest;
  unsigned_long uVar1;
  const_reference ppcVar2;
  Mutex *in_R9;
  Slice local_c8;
  char *local_b8;
  size_t avail;
  char *dst;
  size_t bytes_to_copy;
  size_t block_offset;
  size_t block;
  size_t sStack_88;
  Slice *local_80;
  uint64_t available;
  Slice local_70 [2];
  Slice local_50;
  MutexLock local_40;
  MutexLock lock;
  char *scratch_local;
  Slice *result_local;
  size_t n_local;
  uint64_t offset_local;
  FileState *this_local;
  
  lock.mu_ = in_R9;
  MutexLock::MutexLock(&local_40,(Mutex *)(offset + 0x30));
  if (*(ulong *)(offset + 0x70) < n) {
    Slice::Slice(&local_50,"Offset greater than file size.");
    Slice::Slice(local_70);
    Status::IOError((Status *)this,&local_50,local_70);
  }
  else {
    local_80 = (Slice *)(*(long *)(offset + 0x70) - n);
    result_local = result;
    if (local_80 < result) {
      result_local = local_80;
    }
    if (result_local == (Slice *)0x0) {
      Slice::Slice((Slice *)&block);
      *(size_t *)scratch = block;
      *(size_t *)(scratch + 8) = sStack_88;
      Status::OK();
    }
    else {
      uVar1 = std::numeric_limits<unsigned_long>::max();
      if (uVar1 < n >> 0xd) {
        __assert_fail("offset / kBlockSize <= std::numeric_limits<size_t>::max()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/helpers/memenv/memenv.cc"
                      ,0x56,
                      "Status leveldb::(anonymous namespace)::FileState::Read(uint64_t, size_t, Slice *, char *) const"
                     );
      }
      block_offset = n >> 0xd;
      bytes_to_copy = n & 0x1fff;
      avail = (size_t)lock.mu_;
      for (dst = (char *)result_local; __dest = avail, dst != (char *)0x0;
          dst = dst + -(long)local_b8) {
        local_b8 = (char *)(0x2000 - bytes_to_copy);
        if (dst < local_b8) {
          local_b8 = dst;
        }
        ppcVar2 = std::vector<char_*,_std::allocator<char_*>_>::operator[]
                            ((vector<char_*,_std::allocator<char_*>_> *)(offset + 0x58),block_offset
                            );
        memcpy((void *)__dest,*ppcVar2 + bytes_to_copy,(size_t)local_b8);
        avail = (size_t)(local_b8 + avail);
        block_offset = block_offset + 1;
        bytes_to_copy = 0;
      }
      Slice::Slice(&local_c8,(char *)lock.mu_,(size_t)result_local);
      *(char **)scratch = local_c8.data_;
      *(size_t *)(scratch + 8) = local_c8.size_;
      Status::OK();
    }
  }
  available._4_4_ = 1;
  MutexLock::~MutexLock(&local_40);
  return (Status)(char *)this;
}

Assistant:

Status Read(uint64_t offset, size_t n, Slice* result, char* scratch) const {
    MutexLock lock(&blocks_mutex_);
    if (offset > size_) {
      return Status::IOError("Offset greater than file size.");
    }
    const uint64_t available = size_ - offset;
    if (n > available) {
      n = static_cast<size_t>(available);
    }
    if (n == 0) {
      *result = Slice();
      return Status::OK();
    }

    assert(offset / kBlockSize <= std::numeric_limits<size_t>::max());
    size_t block = static_cast<size_t>(offset / kBlockSize);
    size_t block_offset = offset % kBlockSize;
    size_t bytes_to_copy = n;
    char* dst = scratch;

    while (bytes_to_copy > 0) {
      size_t avail = kBlockSize - block_offset;
      if (avail > bytes_to_copy) {
        avail = bytes_to_copy;
      }
      memcpy(dst, blocks_[block] + block_offset, avail);

      bytes_to_copy -= avail;
      dst += avail;
      block++;
      block_offset = 0;
    }

    *result = Slice(scratch, n);
    return Status::OK();
  }